

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestProgress::testStuff(TestProgress *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  QColor *pQVar4;
  QColor local_90;
  undefined4 local_80;
  QColor local_7c;
  QColor local_6c;
  QColor local_50;
  undefined1 local_40 [8];
  ProgressBar p;
  TestProgress *this_local;
  
  p.d.d = (ProgressBarPrivate *)this;
  QtMWidgets::ProgressBar::ProgressBar((ProgressBar *)local_40,(QWidget *)0x0);
  QColor::QColor(&local_50,red);
  QtMWidgets::ProgressBar::setGrooveColor((ProgressBar *)local_40,&local_50);
  QtMWidgets::ProgressBar::setGrooveHeight((ProgressBar *)local_40,10);
  QColor::QColor(&local_6c,green);
  QtMWidgets::ProgressBar::setHighlightColor((ProgressBar *)local_40,&local_6c);
  pQVar4 = QtMWidgets::ProgressBar::grooveColor((ProgressBar *)local_40);
  QColor::QColor(&local_7c,red);
  bVar1 = (bool)QColor::operator==(pQVar4,&local_7c);
  bVar2 = QTest::qVerify(bVar1,"p.grooveColor() == Qt::red","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                         ,0x84);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    iVar3 = QtMWidgets::ProgressBar::grooveHeight((ProgressBar *)local_40);
    bVar2 = QTest::qVerify(iVar3 == 10,"p.grooveHeight() == 10","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                           ,0x85);
    if ((bVar2 & 1) == 0) {
      local_80 = 1;
    }
    else {
      pQVar4 = QtMWidgets::ProgressBar::highlightColor((ProgressBar *)local_40);
      QColor::QColor(&local_90,green);
      bVar1 = (bool)QColor::operator==(pQVar4,&local_90);
      bVar2 = QTest::qVerify(bVar1,"p.highlightColor() == Qt::green","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                             ,0x86);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        local_80 = 0;
      }
      else {
        local_80 = 1;
      }
    }
  }
  else {
    local_80 = 1;
  }
  QtMWidgets::ProgressBar::~ProgressBar((ProgressBar *)local_40);
  return;
}

Assistant:

void testStuff()
	{
		QtMWidgets::ProgressBar p;

		p.setGrooveColor( Qt::red );
		p.setGrooveHeight( 10 );
		p.setHighlightColor( Qt::green );

		QVERIFY( p.grooveColor() == Qt::red );
		QVERIFY( p.grooveHeight() == 10 );
		QVERIFY( p.highlightColor() == Qt::green );
	}